

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Option<Catch::GroupInfo>::reset(Option<Catch::GroupInfo> *this)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    GroupInfo::~GroupInfo((GroupInfo *)0xe6efe6);
  }
  *in_RDI = 0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = nullptr;
        }